

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O0

void grpc_go_generator::anon_unknown_1::GenerateService
               (Service *service,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  mapped_type *pmVar5;
  pointer pMVar6;
  char *pcVar7;
  allocator<char> local_859;
  key_type local_858;
  allocator<char> local_831;
  key_type local_830;
  allocator<char> local_809;
  key_type local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  allocator<char> local_761;
  key_type local_760;
  string local_740;
  string local_720;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_700;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method_3;
  int i_6;
  allocator<char> local_6c9;
  key_type local_6c8;
  allocator<char> local_6a1;
  key_type local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  allocator<char> local_5f9;
  key_type local_5f8;
  string local_5d8;
  string local_5b8;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_598;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method_2;
  undefined1 local_588 [4];
  int i_5;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_558;
  uint local_54c;
  undefined1 local_548 [4];
  int i_4;
  allocator<char> local_511;
  key_type local_510;
  allocator<char> local_4e9;
  key_type local_4e8;
  string local_4c8;
  string local_4a8;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_488;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method_1;
  int i_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_458;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_428;
  uint local_420;
  allocator<char> local_419;
  int i_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  allocator<char> local_3c1;
  key_type local_3c0;
  string local_3a0;
  allocator<char> local_379;
  key_type local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  allocator<char> local_2f1;
  key_type local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  key_type local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_228;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method;
  int i_1;
  allocator<char> local_1f1;
  key_type local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int local_18c;
  int local_188;
  int streaming_methods;
  int unary_methods;
  allocator<char> local_159;
  key_type local_158;
  string local_138;
  string local_118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_c8;
  uint local_c0;
  allocator<char> local_b9;
  int i;
  allocator<char> local_91;
  key_type local_90;
  string local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  Printer *printer_local;
  Service *service_local;
  
  local_20 = vars;
  vars_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)printer;
  printer_local = (Printer *)service;
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])();
  exportName(&local_40,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Service",&local_91);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_90);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"// Client API for $Service$ service\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"type $Service$Client interface {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"Ending",&local_b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,(key_type *)&i);
  std::__cxx11::string::operator=((string *)pmVar5,"\n");
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_b9);
  for (local_c0 = 0; uVar4 = local_c0, iVar3 = (*printer_local->_vptr_Printer[8])(),
      (int)uVar4 < iVar3; local_c0 = local_c0 + 1) {
    (*printer_local->_vptr_Printer[9])(&local_c8,printer_local,(ulong)local_c0);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_c8);
    pmVar1 = vars_local;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&local_f8,vars);
    GenerateClientMethodSignature(pMVar6,(Printer *)pmVar1,&local_f8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(&local_f8);
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_c8);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Service",&local_159);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_158);
  std::__cxx11::string::string((string *)&local_138,(string *)pmVar5);
  unexportName(&local_118,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unary_methods,"ServiceUnexported",
             (allocator<char> *)((long)&streaming_methods + 3));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,(key_type *)&unary_methods);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_118);
  std::__cxx11::string::~string((string *)&unary_methods);
  std::allocator<char>::~allocator((allocator<char> *)((long)&streaming_methods + 3));
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"type $ServiceUnexported$Client struct {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"cc $grpc$.ClientConnInterface\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,
             "func New$Service$Client(cc $grpc$.ClientConnInterface) $Service$Client {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"return &$ServiceUnexported$Client{cc}");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"\n}\n\n");
  local_188 = 0;
  local_18c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Service",&local_1f1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_1f0);
  std::operator+(&local_1d0,"_",pmVar5);
  std::operator+(&local_1b0,&local_1d0,"_serviceDesc");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_1,"ServiceDesc",
             (allocator<char> *)
             ((long)&method._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,(key_type *)&i_1);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&method._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  for (method._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
      uVar4 = (uint)method._M_t.
                    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl,
      iVar3 = (*printer_local->_vptr_Printer[8])(), (int)uVar4 < iVar3;
      method._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
      .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
           (uint)method._M_t.
                 super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                 .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1) {
    (*printer_local->_vptr_Printer[9])
              (&local_228,printer_local,
               (ulong)(uint)method._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_228);
    uVar4 = (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[0xf])();
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"ServiceDesc",&local_379);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](vars,&local_378);
      std::operator+(&local_358,pmVar5,".Streams[");
      as_string<int>(&local_3a0,local_18c);
      std::operator+(&local_338,&local_358,&local_3a0);
      std::operator+(&local_318,&local_338,"]");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"MethodDesc",&local_3c1);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](vars,&local_3c0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
      local_18c = local_18c + 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"ServiceDesc",&local_2a9);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](vars,&local_2a8);
      std::operator+(&local_288,pmVar5,".Method[");
      as_string<int>(&local_2d0,local_188);
      std::operator+(&local_268,&local_288,&local_2d0);
      std::operator+(&local_248,&local_268,"]");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"MethodDesc",&local_2f1);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](vars,&local_2f0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      local_188 = local_188 + 1;
    }
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_228);
    pmVar1 = vars_local;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&local_3f8,vars);
    GenerateClientMethod(pMVar6,(Printer *)pmVar1,&local_3f8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(&local_3f8);
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_228);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"// Server API for $Service$ service\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"type $Service$Server interface {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i_2,"Ending",&local_419);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,(key_type *)&i_2);
  std::__cxx11::string::operator=((string *)pmVar5,"\n");
  std::__cxx11::string::~string((string *)&i_2);
  std::allocator<char>::~allocator(&local_419);
  for (local_420 = 0; uVar4 = local_420, iVar3 = (*printer_local->_vptr_Printer[8])(),
      (int)uVar4 < iVar3; local_420 = local_420 + 1) {
    (*printer_local->_vptr_Printer[9])(&local_428,printer_local,(ulong)local_420);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_428);
    pmVar1 = vars_local;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&local_458,vars);
    GenerateServerMethodSignature(pMVar6,(Printer *)pmVar1,&local_458);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(&local_458);
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_428);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"mustEmbedUnimplemented$Service$Server()\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"type Unimplemented$Service$Server struct {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_3,"Ending",
             (allocator<char> *)
             ((long)&method_1._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,(key_type *)&i_3);
  std::__cxx11::string::operator=((string *)pmVar5," {\n");
  std::__cxx11::string::~string((string *)&i_3);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&method_1._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  for (method_1._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
      uVar4 = (uint)method_1._M_t.
                    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl,
      iVar3 = (*printer_local->_vptr_Printer[8])(), (int)uVar4 < iVar3;
      method_1._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
      .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
           (uint)method_1._M_t.
                 super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                 .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1) {
    (*printer_local->_vptr_Printer[9])
              (&local_488,printer_local,
               (ulong)(uint)method_1._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_488);
    (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[5])(&local_4c8);
    exportName(&local_4a8,&local_4c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"Method",&local_4e9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_4e8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_488);
    uVar4 = (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[0xf])();
    pcVar7 = "";
    if ((uVar4 & 1) != 0) {
      pcVar7 = "nil, ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"Nil",&local_511);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_510);
    std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
              (vars_local,vars,"func (Unimplemented$Service$Server) ");
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_488);
    pmVar1 = vars_local;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_548,vars);
    GenerateServerMethodSignature
              (pMVar6,(Printer *)pmVar1,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_548);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_548);
    (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
    (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
              (vars_local,vars,
               "return $Nil$status.Errorf(codes.Unimplemented, \"method $Method$ not implemented\")\n"
              );
    (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
    (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n");
    (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"\n");
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_488);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,
             "func (Unimplemented$Service$Server) mustEmbedUnimplemented$Service$Server() {}");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"\n\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"type Unsafe$Service$Server interface {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"mustEmbedUnimplemented$Service$Server()\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,
             "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv $Service$Server) {\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"s.RegisterService(&$ServiceDesc$, srv)\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n\n");
  for (local_54c = 0; uVar4 = local_54c, iVar3 = (*printer_local->_vptr_Printer[8])(),
      (int)uVar4 < iVar3; local_54c = local_54c + 1) {
    (*printer_local->_vptr_Printer[9])(&local_558,printer_local,(ulong)local_54c);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_558);
    pmVar1 = vars_local;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_588,vars);
    GenerateServerMethod
              (pMVar6,(Printer *)pmVar1,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_588);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_588);
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_558);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"ServiceName: \"$ServicePrefix$$Service$\",\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"HandlerType: (*$Service$Server)(nil),\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"Methods: []$grpc$.MethodDesc{\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  for (method_2._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._4_4_ = 0;
      uVar4 = method_2._M_t.
              super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
              .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._4_4_,
      iVar3 = (*printer_local->_vptr_Printer[8])(), (int)uVar4 < iVar3;
      method_2._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
      .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._4_4_ =
           method_2._M_t.
           super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
           .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._4_4_ + 1) {
    (*printer_local->_vptr_Printer[9])
              (&local_598,printer_local,
               (ulong)method_2._M_t.
                      super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                      .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl.
                      _4_4_);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_598);
    (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[5])(&local_5d8);
    exportName(&local_5b8,&local_5d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"Method",&local_5f9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_5f8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"Service",&local_6a1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_6a0);
    std::operator+(&local_680,"_",pmVar5);
    std::operator+(&local_660,&local_680,"_");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"Method",&local_6c9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_6c8);
    std::operator+(&local_640,&local_660,pmVar5);
    std::operator+(&local_620,&local_640,"_Handler");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_6,"Handler",
               (allocator<char> *)
               ((long)&method_3._M_t.
                       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl +
               7));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,(key_type *)&i_6);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_620);
    std::__cxx11::string::~string((string *)&i_6);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&method_3._M_t.
                       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl +
               7));
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::allocator<char>::~allocator(&local_6c9);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator(&local_6a1);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_598);
    uVar4 = (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[0xf])();
    if ((uVar4 & 1) != 0) {
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"{\n");
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
                (vars_local,vars,"MethodName: \"$Method$\",\n");
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
                (vars_local,vars,"Handler:    $Handler$,\n");
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"},\n");
    }
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_598);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"},\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
            (vars_local,vars,"Streams: []$grpc$.StreamDesc{\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
  for (method_3._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
      uVar4 = (uint)method_3._M_t.
                    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl,
      iVar3 = (*printer_local->_vptr_Printer[8])(), (int)uVar4 < iVar3;
      method_3._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
      .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
           (uint)method_3._M_t.
                 super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                 .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1) {
    (*printer_local->_vptr_Printer[9])
              (&local_700,printer_local,
               (ulong)(uint)method_3._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_700);
    (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[5])(&local_740);
    exportName(&local_720,&local_740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"Method",&local_761);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_760);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_720);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"Service",&local_809);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_808);
    std::operator+(&local_7e8,"_",pmVar5);
    std::operator+(&local_7c8,&local_7e8,"_");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"Method",&local_831);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_830);
    std::operator+(&local_7a8,&local_7c8,pmVar5);
    std::operator+(&local_788,&local_7a8,"_Handler");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"Handler",&local_859);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_858);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_788);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator(&local_859);
    std::__cxx11::string::~string((string *)&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator(&local_831);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
    pMVar6 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_700);
    uVar4 = (*(pMVar6->super_CommentHolder)._vptr_CommentHolder[0xf])();
    if ((uVar4 & 1) == 0) {
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"{\n");
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x28))();
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
                (vars_local,vars,"StreamName:    \"$Method$\",\n");
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x10))
                (vars_local,vars,"Handler:       $Handler$,\n");
      pMVar6 = std::
               unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
               ::get(&local_700);
      bVar2 = ClientOnlyStreaming(pMVar6);
      if (bVar2) {
        (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))
                  (vars_local,"ClientStreams: true,\n");
      }
      else {
        pMVar6 = std::
                 unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                 ::get(&local_700);
        bVar2 = ServerOnlyStreaming(pMVar6);
        if (bVar2) {
          (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))
                    (vars_local,"ServerStreams: true,\n");
        }
        else {
          (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))
                    (vars_local,"ServerStreams: true,\n");
          (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))
                    (vars_local,"ClientStreams: true,\n");
        }
      }
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
      (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"},\n");
    }
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_700);
  }
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"},\n");
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x30))();
  (**(code **)(*(long *)&(vars_local->_M_t)._M_impl + 0x18))(vars_local,"}\n");
  return;
}

Assistant:

void GenerateService(const grpc_generator::Service *service,
                     grpc_generator::Printer *printer,
                     std::map<grpc::string, grpc::string> vars) {
  vars["Service"] = exportName(service->name());
  // Client Interface
  printer->Print(vars, "// Client API for $Service$ service\n");
  printer->Print(vars, "type $Service$Client interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateClientMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Outdent();
  printer->Print("}\n\n");

  // Client structure
  vars["ServiceUnexported"] = unexportName(vars["Service"]);
  printer->Print(vars, "type $ServiceUnexported$Client struct {\n");
  printer->Indent();
  printer->Print(vars, "cc $grpc$.ClientConnInterface\n");
  printer->Outdent();
  printer->Print("}\n\n");

  // NewClient
  printer->Print(vars,
                 "func New$Service$Client(cc $grpc$.ClientConnInterface) "
                 "$Service$Client {\n");
  printer->Indent();
  printer->Print(vars, "return &$ServiceUnexported$Client{cc}");
  printer->Outdent();
  printer->Print("\n}\n\n");

  int unary_methods = 0, streaming_methods = 0;
  vars["ServiceDesc"] = "_" + vars["Service"] + "_serviceDesc";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    if (method->NoStreaming()) {
      vars["MethodDesc"] =
          vars["ServiceDesc"] + ".Method[" + as_string(unary_methods) + "]";
      unary_methods++;
    } else {
      vars["MethodDesc"] = vars["ServiceDesc"] + ".Streams[" +
                           as_string(streaming_methods) + "]";
      streaming_methods++;
    }
    GenerateClientMethod(method.get(), printer, vars);
  }

  // Server Interface
  printer->Print(vars, "// Server API for $Service$ service\n");
  printer->Print(vars, "type $Service$Server interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");

  printer->Print(vars, "type Unimplemented$Service$Server struct {\n");
  printer->Print("}\n\n");

  vars["Ending"] = " {\n";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Nil"] = method->NoStreaming() ? "nil, " : "";
    printer->Print(vars, "func (Unimplemented$Service$Server) ");
    GenerateServerMethodSignature(method.get(), printer, vars);
    printer->Indent();
    printer->Print(vars,
                   "return $Nil$status.Errorf(codes.Unimplemented, \"method "
                   "$Method$ not implemented\")\n");
    printer->Outdent();
    printer->Print("}\n");
    printer->Print("\n");
  }

  printer->Print(vars,
                 "func (Unimplemented$Service$Server) "
                 "mustEmbedUnimplemented$Service$Server() {}");
  printer->Print("\n\n");

  printer->Print(vars, "type Unsafe$Service$Server interface {\n");
  printer->Indent();
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");
  // Server registration.
  printer->Print(vars,
                 "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv "
                 "$Service$Server) {\n");
  printer->Indent();
  printer->Print(vars, "s.RegisterService(&$ServiceDesc$, srv)\n");
  printer->Outdent();
  printer->Print("}\n\n");

  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethod(service->method(i).get(), printer, vars);
  }

  // Service Descriptor
  printer->Print(vars, "var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  printer->Indent();
  printer->Print(vars, "ServiceName: \"$ServicePrefix$$Service$\",\n");
  printer->Print(vars, "HandlerType: (*$Service$Server)(nil),\n");
  printer->Print(vars, "Methods: []$grpc$.MethodDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "MethodName: \"$Method$\",\n");
      printer->Print(vars, "Handler:    $Handler$,\n");
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Print(vars, "Streams: []$grpc$.StreamDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (!method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "StreamName:    \"$Method$\",\n");
      printer->Print(vars, "Handler:       $Handler$,\n");
      if (ClientOnlyStreaming(method.get())) {
        printer->Print("ClientStreams: true,\n");
      } else if (ServerOnlyStreaming(method.get())) {
        printer->Print("ServerStreams: true,\n");
      } else {
        printer->Print("ServerStreams: true,\n");
        printer->Print("ClientStreams: true,\n");
      }
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Outdent();
  printer->Print("}\n");
}